

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processDisconnect(CommonCore *this,bool skipUnregister)

{
  BrokerBase *this_00;
  BrokerState BVar1;
  int iVar2;
  ActionMessage dis;
  ActionMessage AStack_d8;
  
  this_00 = &this->super_BrokerBase;
  BVar1 = (this->super_BrokerBase).brokerState._M_i;
  if (CONFIGURED < BVar1) {
    if (BVar1 < TERMINATING) {
      BrokerBase::setBrokerState(this_00,TERMINATING);
      sendDisconnect(this,cmd_stop);
      iVar2 = (this->super_BrokerBase).global_broker_id_local.gid;
      if (((iVar2 == -2010000000) || (iVar2 == -1700000000)) || (iVar2 == 0)) {
        ActionMessage::ActionMessage(&AStack_d8,cmd_disconnect_name);
        SmallBuffer::operator=
                  (&AStack_d8.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_BrokerBase).identifier);
        (*(this->super_Core)._vptr_Core[0x6b])(this,0,&AStack_d8);
      }
      else {
        ActionMessage::ActionMessage(&AStack_d8,cmd_disconnect);
        AStack_d8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        (*(this->super_Core)._vptr_Core[0x6b])(this,0,&AStack_d8);
      }
      ActionMessage::~ActionMessage(&AStack_d8);
      ActionMessage::ActionMessage(&AStack_d8,cmd_stop);
      BrokerBase::addActionMessage(this_00,&AStack_d8);
      ActionMessage::~ActionMessage(&AStack_d8);
      return;
    }
    (*(this->super_Core)._vptr_Core[0x68])(this);
  }
  BrokerBase::setBrokerState(this_00,TERMINATED);
  if (!skipUnregister) {
    unregister(this);
  }
  gmlc::concurrency::TriggerVariable::trigger(&this->disconnection);
  return;
}

Assistant:

void CommonCore::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState > BrokerState::CONFIGURED) {
        if (cBrokerState < BrokerState::TERMINATING) {
            setBrokerState(BrokerState::TERMINATING);
            sendDisconnect();
            if ((global_broker_id_local != parent_broker_id) &&
                (global_broker_id_local.isValid())) {
                ActionMessage dis(CMD_DISCONNECT);
                dis.source_id = global_broker_id_local;
                transmit(parent_route_id, dis);
            } else {
                ActionMessage dis(CMD_DISCONNECT_NAME);
                dis.payload = getIdentifier();
                transmit(parent_route_id, dis);
            }
            addActionMessage(CMD_STOP);
            return;
        }
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);
    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}